

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

int Saig_ManBmcSetLiteral(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame,int iLit)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  uint uVar4;
  
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    uVar4 = pObj->Id;
    if ((int)uVar4 < 0) goto LAB_00513573;
  }
  else {
    uVar4 = pObj->Id;
    if ((long)(int)uVar4 < 0) goto LAB_00513573;
    uVar1 = p->vMapping->nSize;
    if ((int)uVar1 <= (int)uVar4) goto LAB_00513573;
    uVar2 = p->vMapping->pArray[(int)uVar4];
    if (uVar2 == 0) {
      __assert_fail("!Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc3.c"
                    ,0x366,"int Saig_ManBmcSetLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int, int)");
    }
    if (((int)uVar2 < 0) || (uVar1 <= uVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
  }
  if ((int)uVar4 < p->vId2Num->nSize) {
    if ((iFrame < 0) || (p->vId2Var->nSize <= iFrame)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar4 = p->vId2Num->pArray[uVar4];
    if ((-1 < (int)uVar4) &&
       (pvVar3 = p->vId2Var->pArray[(uint)iFrame], (int)uVar4 < *(int *)((long)pvVar3 + 4))) {
      *(int *)(*(long *)((long)pvVar3 + 8) + (ulong)uVar4 * 4) = iLit;
      return iLit;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_00513573:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int Saig_ManBmcSetLiteral( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame, int iLit )
{
    Vec_Int_t * vFrame;
    int ObjNum;
    assert( !Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj) );
    ObjNum  = Vec_IntEntry( p->vId2Num, Aig_ObjId(pObj) );
    vFrame  = (Vec_Int_t *)Vec_PtrEntry( p->vId2Var, iFrame );
    Vec_IntWriteEntry( vFrame, ObjNum, iLit );
/*
    if ( Vec_IntEntry( p->vMapRefs, Aig_ObjId(pObj) ) > 1 )
        p->nLitUsed++;
    else
        p->nLitUseless++;
*/
    return iLit;
}